

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O2

void __thiscall SuiteFieldMapTests::TesttotalFields::RunImpl(TesttotalFields *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  unsigned_long local_188;
  message_order local_180;
  int local_15c;
  FieldMap group1;
  undefined1 local_154 [8];
  undefined8 uStack_14c;
  undefined8 local_144;
  FieldMap group2;
  undefined1 local_e4 [8];
  undefined8 uStack_dc;
  undefined8 local_d4;
  FieldMap fieldMap;
  
  _group1 = normal;
  local_154 = (undefined1  [8])0x0;
  uStack_14c = 0;
  local_144 = 0;
  FIX::FieldMap::FieldMap(&fieldMap,(message_order *)&group1);
  FIX::shared_array<int>::~shared_array((shared_array<int> *)(local_154 + 4));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&group1,"field1",(allocator<char> *)&group2);
  FIX::FieldMap::setField(&fieldMap,1,(string *)&group1);
  std::__cxx11::string::~string((string *)&group1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&group1,"field2",(allocator<char> *)&group2);
  FIX::FieldMap::setField(&fieldMap,2,(string *)&group1);
  std::__cxx11::string::~string((string *)&group1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&group1,"field3",(allocator<char> *)&group2);
  FIX::FieldMap::setField(&fieldMap,3,(string *)&group1);
  std::__cxx11::string::~string((string *)&group1);
  _group2 = normal;
  local_e4 = (undefined1  [8])0x0;
  uStack_dc = 0;
  local_d4 = 0;
  FIX::FieldMap::FieldMap(&group1,(message_order *)&group2);
  FIX::shared_array<int>::~shared_array((shared_array<int> *)(local_e4 + 4));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&group2,"field4",(allocator<char> *)&local_180);
  FIX::FieldMap::setField(&group1,4,(string *)&group2);
  std::__cxx11::string::~string((string *)&group2);
  FIX::FieldMap::addGroup((int)&fieldMap,(FieldMap *)0xa,SUB81(&group1,0));
  local_180.m_mode = normal;
  local_180._4_8_ = 0;
  local_180.m_groupOrder._4_8_ = 0;
  local_180._20_8_ = 0;
  FIX::FieldMap::FieldMap(&group2,&local_180);
  FIX::shared_array<int>::~shared_array(&local_180.m_groupOrder);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"field5",(allocator<char> *)&local_188);
  FIX::FieldMap::setField(&group2,5,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"field6",(allocator<char> *)&local_188);
  FIX::FieldMap::setField(&group2,6,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  FIX::FieldMap::addGroup((int)&fieldMap,(FieldMap *)0x14,SUB81(&group2,0));
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  local_15c = 8;
  local_188 = FIX::FieldMap::totalFields();
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_180,*ppTVar2,0x78);
  UnitTest::CheckEqual<int,unsigned_long>(results,&local_15c,&local_188,(TestDetails *)&local_180);
  FIX::FieldMap::~FieldMap(&group2);
  FIX::FieldMap::~FieldMap(&group1);
  FIX::FieldMap::~FieldMap(&fieldMap);
  return;
}

Assistant:

TEST(totalFields)
{
  FieldMap fieldMap;
  fieldMap.setField(1, "field1");
  fieldMap.setField(2, "field2");
  fieldMap.setField(3, "field3");

  FieldMap group1;
  group1.setField(4, "field4");
  fieldMap.addGroup(10, group1);
  FieldMap group2;
  group2.setField(5, "field5");
  group2.setField(6, "field6");
  fieldMap.addGroup(20, group2);

  CHECK_EQUAL(8, fieldMap.totalFields());
}